

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_list_handler.c
# Opt level: O1

void sldict_init(ion_dictionary_handler_t *handler)

{
  handler->insert = sldict_insert;
  handler->get = sldict_get;
  handler->create_dictionary = sldict_create_dictionary;
  handler->remove = sldict_delete;
  handler->delete_dictionary = sldict_delete_dictionary;
  handler->destroy_dictionary = sldict_destroy_dictionary;
  handler->update = sldict_update;
  handler->find = sldict_find;
  handler->close_dictionary = sldict_close_dictionary;
  handler->open_dictionary = sldict_open_dictionary;
  return;
}

Assistant:

void
sldict_init(
	ion_dictionary_handler_t *handler
) {
	handler->insert				= sldict_insert;
	handler->get				= sldict_get;
	handler->create_dictionary	= sldict_create_dictionary;
	handler->remove				= sldict_delete;
	handler->delete_dictionary	= sldict_delete_dictionary;
	handler->destroy_dictionary = sldict_destroy_dictionary;
	handler->update				= sldict_update;
	handler->find				= sldict_find;
	handler->close_dictionary	= sldict_close_dictionary;
	handler->open_dictionary	= sldict_open_dictionary;
}